

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

CSVOption<duckdb::StrpTimeFormat> *
duckdb::CSVOption<duckdb::StrpTimeFormat>::Deserialize
          (CSVOption<duckdb::StrpTimeFormat> *__return_storage_ptr__,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  
  __return_storage_ptr__->set_by_user = false;
  StrpTimeFormat::StrpTimeFormat(&__return_storage_ptr__->value);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"set_by_user");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->set_by_user = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  Deserializer::ReadProperty<duckdb::StrpTimeFormat>
            (deserializer,0x65,"value",&__return_storage_ptr__->value);
  return __return_storage_ptr__;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}